

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

reverse_iterator<unsigned_short_*>
math::wide_integer::detail::
import_export_helper<unsigned_short_const*,math::wide_integer::detail::iterator_detail::reverse_iterator<unsigned_short*>>
          (unsigned_short *in,reverse_iterator<unsigned_short_*> out,
          signed_fast_type total_bits_to_use,unsigned_fast_type chunk_size_in,
          unsigned_fast_type chunk_size_out)

{
  ushort uVar1;
  ulong uVar2;
  reference pvVar3;
  reverse_iterator<unsigned_short_*> *this;
  ulong uVar4;
  bool go_to_next_input_elem;
  bool go_to_next_result_elem;
  local_output_value_type result_bpos;
  bool input_bval_is_set;
  unsigned_fast_type input_bpos;
  long i;
  long local_48;
  unsigned_fast_type local_40;
  long size_to_loop_through;
  unsigned_fast_type chunk_size_out_local;
  unsigned_fast_type chunk_size_in_local;
  signed_fast_type total_bits_to_use_local;
  unsigned_short *in_local;
  reverse_iterator<unsigned_short_*> out_local;
  
  local_48 = total_bits_to_use + -1;
  i = -1;
  size_to_loop_through = chunk_size_out;
  chunk_size_out_local = chunk_size_in;
  chunk_size_in_local = total_bits_to_use;
  total_bits_to_use_local = (signed_fast_type)in;
  in_local = out.current;
  local_40 = max_unsafe<long>(&local_48,&i);
  if (-1 < (long)local_40) {
    pvVar3 = iterator_detail::reverse_iterator<unsigned_short_*>::operator*
                       ((reverse_iterator<unsigned_short_*> *)&in_local);
    *pvVar3 = 0;
    for (input_bpos = local_40; -1 < (long)input_bpos; input_bpos = input_bpos - 1) {
      uVar4 = input_bpos % chunk_size_out_local;
      uVar2 = input_bpos % (ulong)size_to_loop_through;
      if (((uint)*(ushort *)total_bits_to_use_local & 1 << ((byte)uVar4 & 0x1f) & 0xffffU) != 0) {
        pvVar3 = iterator_detail::reverse_iterator<unsigned_short_*>::operator*
                           ((reverse_iterator<unsigned_short_*> *)&in_local);
        uVar1 = *pvVar3;
        pvVar3 = iterator_detail::reverse_iterator<unsigned_short_*>::operator*
                           ((reverse_iterator<unsigned_short_*> *)&in_local);
        *pvVar3 = uVar1 | (ushort)(1 << ((byte)uVar2 & 0x1f));
      }
      if (((short)uVar2 == 0) && (input_bpos != 0)) {
        this = iterator_detail::reverse_iterator<unsigned_short_*>::operator++
                         ((reverse_iterator<unsigned_short_*> *)&in_local);
        pvVar3 = iterator_detail::reverse_iterator<unsigned_short_*>::operator*(this);
        *pvVar3 = 0;
      }
      if ((uVar4 == 0) && (input_bpos != 0)) {
        total_bits_to_use_local = total_bits_to_use_local + 2;
      }
    }
  }
  return (reverse_iterator<unsigned_short_*>)in_local;
}

Assistant:

constexpr
  auto import_export_helper(      ForwardIterator    in,
                                  OutputIterator     out,
                            const   signed_fast_type total_bits_to_use, // NOLINT(bugprone-easily-swappable-parameters)
                            const unsigned_fast_type chunk_size_in,
                            const unsigned_fast_type chunk_size_out) -> OutputIterator
  {
    const auto size_to_loop_through =
      (detail::max_unsafe)
      (
        static_cast<signed_fast_type>(total_bits_to_use - static_cast<signed_fast_type>(INT8_C(1))),
        static_cast<signed_fast_type>(INT8_C(-1))
      );

    if(size_to_loop_through > static_cast<signed_fast_type>(INT8_C(-1)))
    {
      using local_output_value_type = typename detail::iterator_detail::iterator_traits<OutputIterator>::value_type;

      *out = static_cast<local_output_value_type>(UINT8_C(0));

      for(auto   i  = size_to_loop_through;
                 i >= static_cast<signed_fast_type>(INT8_C(0)); // NOLINT(altera-id-dependent-backward-branch)
               --i)
      {
        const auto input_bpos =
          static_cast<unsigned_fast_type>
          (
            static_cast<unsigned_fast_type>(i) % chunk_size_in
          );

        using local_input_value_type  = typename detail::iterator_detail::iterator_traits<ForwardIterator>::value_type;

        const auto input_bval_is_set =
        (
          static_cast<local_input_value_type>
          (
              *in
            & static_cast<local_input_value_type>(static_cast<local_input_value_type>(UINT8_C(1)) << input_bpos)
          )
          != static_cast<local_input_value_type>(UINT8_C(0))
        );

        const auto result_bpos =
          static_cast<local_output_value_type>
          (
            static_cast<unsigned_fast_type>(i) % chunk_size_out
          );

        if(input_bval_is_set)
        {
          *out =
            static_cast<local_output_value_type>
            (
                *out
              | static_cast<local_output_value_type>
                (
                  static_cast<local_output_value_type>(UINT8_C(1)) << result_bpos
                )
            );
        }

        const auto go_to_next_result_elem = (result_bpos == static_cast<local_output_value_type>(UINT8_C(0)));

        if(go_to_next_result_elem && (i != static_cast<signed_fast_type>(INT8_C(0))))
        {
          *(++out) = static_cast<local_output_value_type>(UINT8_C(0));
        }

        const auto go_to_next_input_elem = (input_bpos == static_cast<unsigned_fast_type>(UINT8_C(0)));

        if(go_to_next_input_elem && (i != static_cast<signed_fast_type>(INT8_C(0))))
        {
          ++in;
        }
      }
    }

    return out;
  }